

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_iov.c
# Opt level: O1

void mk_iov_print(mk_iov *mk_io)

{
  iovec *piVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (0 < mk_io->iov_idx) {
    uVar3 = 0;
    do {
      printf("\n[index=%i len=%i]\n\'",uVar3 & 0xffffffff,(ulong)(uint)mk_io->io[uVar3].iov_len);
      fflush(_stdout);
      piVar1 = mk_io->io;
      uVar2 = 0;
      if (piVar1[uVar3].iov_len != 0) {
        uVar2 = 0;
        do {
          putchar((int)*(char *)((long)piVar1[uVar3].iov_base + uVar2));
          fflush(_stdout);
          uVar2 = (ulong)((int)uVar2 + 1);
          piVar1 = mk_io->io;
        } while (uVar2 < piVar1[uVar3].iov_len);
      }
      printf("\'[end=%i]\n",uVar2);
      fflush(_stdout);
      uVar3 = uVar3 + 1;
    } while ((long)uVar3 < (long)mk_io->iov_idx);
  }
  return;
}

Assistant:

void mk_iov_print(struct mk_iov *mk_io)
{
    int i;
    unsigned j;
    char *c;

    for (i = 0; i < mk_io->iov_idx; i++) {
        printf("\n[index=%i len=%i]\n'", i, (int) mk_io->io[i].iov_len);
        fflush(stdout);

        for (j=0; j < mk_io->io[i].iov_len; j++) {
            c = mk_io->io[i].iov_base;
            printf("%c", c[j]);
            fflush(stdout);
        }
        printf("'[end=%i]\n", j);
        fflush(stdout);
    }
}